

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulelist.cpp
# Opt level: O3

void __thiscall TPZIntRuleList::~TPZIntRuleList(TPZIntRuleList *this)

{
  int64_t *piVar1;
  TPZGaussRule *this_00;
  TPZGaussRule **ppTVar2;
  TPZIntRuleT *this_01;
  TPZIntRuleT **ppTVar3;
  TPZIntRuleT3D *this_02;
  TPZIntRuleT3D **ppTVar4;
  TPZIntRuleP3D *this_03;
  TPZIntRuleP3D **ppTVar5;
  long lVar6;
  long lVar7;
  
  piVar1 = &(this->fintlist).fNElements;
  lVar6 = (this->fintlist).fNElements;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      this_00 = (this->fintlist).fStore[lVar7];
      if (this_00 != (TPZGaussRule *)0x0) {
        TPZGaussRule::~TPZGaussRule(this_00);
        operator_delete(this_00,0x80);
        lVar6 = *piVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar6);
  }
  if (lVar6 != 0) {
    *piVar1 = 0;
    (this->fintlist).fNAlloc = 0;
    ppTVar2 = (this->fintlist).fStore;
    if (ppTVar2 != (TPZGaussRule **)0x0) {
      operator_delete__(ppTVar2);
    }
    (this->fintlist).fStore = (TPZGaussRule **)0x0;
  }
  piVar1 = &(this->fintlistT).fNElements;
  lVar6 = (this->fintlistT).fNElements;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      this_01 = (this->fintlistT).fStore[lVar7];
      if (this_01 != (TPZIntRuleT *)0x0) {
        TPZIntRuleT::~TPZIntRuleT(this_01);
        operator_delete(this_01,0x260);
        lVar6 = *piVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar6);
  }
  if (lVar6 != 0) {
    *piVar1 = 0;
    (this->fintlistT).fNAlloc = 0;
    ppTVar3 = (this->fintlistT).fStore;
    if (ppTVar3 != (TPZIntRuleT **)0x0) {
      operator_delete__(ppTVar3);
    }
    (this->fintlistT).fStore = (TPZIntRuleT **)0x0;
  }
  piVar1 = &(this->fintlistT3D).fNElements;
  lVar6 = (this->fintlistT3D).fNElements;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      this_02 = (this->fintlistT3D).fStore[lVar7];
      if (this_02 != (TPZIntRuleT3D *)0x0) {
        TPZIntRuleT3D::~TPZIntRuleT3D(this_02);
        operator_delete(this_02,800);
        lVar6 = *piVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar6);
  }
  if (lVar6 != 0) {
    *piVar1 = 0;
    (this->fintlistT3D).fNAlloc = 0;
    ppTVar4 = (this->fintlistT3D).fStore;
    if (ppTVar4 != (TPZIntRuleT3D **)0x0) {
      operator_delete__(ppTVar4);
    }
    (this->fintlistT3D).fStore = (TPZIntRuleT3D **)0x0;
  }
  piVar1 = &(this->fintlistP3D).fNElements;
  lVar6 = (this->fintlistP3D).fNElements;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      this_03 = (this->fintlistP3D).fStore[lVar7];
      if (this_03 != (TPZIntRuleP3D *)0x0) {
        TPZIntRuleP3D::~TPZIntRuleP3D(this_03);
        operator_delete(this_03,0x90);
        lVar6 = *piVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar6);
  }
  if (lVar6 == 0) {
    ppTVar5 = (this->fintlistP3D).fStore;
    (this->fintlistP3D)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ca30;
    if (ppTVar5 != (TPZIntRuleP3D **)0x0) {
      operator_delete__(ppTVar5);
    }
  }
  else {
    *piVar1 = 0;
    (this->fintlistP3D).fNAlloc = 0;
    ppTVar5 = (this->fintlistP3D).fStore;
    if (ppTVar5 != (TPZIntRuleP3D **)0x0) {
      operator_delete__(ppTVar5);
    }
    (this->fintlistP3D).fStore = (TPZIntRuleP3D **)0x0;
    (this->fintlistP3D)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ca30;
  }
  (this->fintlistT3D)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181c9e0;
  ppTVar4 = (this->fintlistT3D).fStore;
  if (ppTVar4 != (TPZIntRuleT3D **)0x0) {
    operator_delete__(ppTVar4);
  }
  (this->fintlistT)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181c990;
  ppTVar3 = (this->fintlistT).fStore;
  if (ppTVar3 != (TPZIntRuleT **)0x0) {
    operator_delete__(ppTVar3);
  }
  (this->fintlist)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181c940;
  ppTVar2 = (this->fintlist).fStore;
  if (ppTVar2 != (TPZGaussRule **)0x0) {
    operator_delete__(ppTVar2);
    return;
  }
  return;
}

Assistant:

TPZIntRuleList::~TPZIntRuleList() {
	int i;
	/** Deleting dinamic allocation of the Gauss integration rules at the vector */
	for(i=0 ; i<fintlist.NElements() ; i++)   if (fintlist[i])   delete fintlist[i];
	fintlist.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for triangle at the vector */
	for(i=0 ; i<fintlistT.NElements() ; i++)   if (fintlistT[i])   delete fintlistT[i];
	fintlistT.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for tetrahedra at the vector */
	for(i=0 ; i<fintlistT3D.NElements() ; i++)   if (fintlistT3D[i])   delete fintlistT3D[i];
	fintlistT3D.Resize(0);
	
	/** Deleting dinamic allocation of the cubature rules for pyramid at the vector */
	for(i=0 ; i<fintlistP3D.NElements() ; i++)   if (fintlistP3D[i])   delete fintlistP3D[i];
	fintlistP3D.Resize(0);
}